

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

Vec_Wrd_t * Abc_NtkShareSuperAnd(Abc_Obj_t *pObj,int *pCounter)

{
  Abc_Ntk_t *pAVar1;
  ulong *puVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  word *pwVar5;
  ulong uVar6;
  long *plVar7;
  word wVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0xa6,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  pAVar1 = pObj->pNtk;
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  pwVar5 = (word *)malloc(0x80);
  p->pArray = pwVar5;
  if (pObj->Id < 0) {
LAB_002544f8:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  Vec_WrdPush(p,(ulong)(*(uint *)&pObj->field_0x14 >> 0xc) << 0x20 | (ulong)(uint)pObj->Id * 2);
  uVar4 = p->nSize;
LAB_0025419f:
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
    puVar2 = p->pArray;
    if (1 < (int)uVar4) {
      uVar6 = 1;
      uVar15 = *puVar2;
      do {
        puVar10 = puVar2 + uVar6;
        if (*puVar10 <= uVar15) {
          __assert_fail("Num < NumNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                        ,0xb0,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
        }
        uVar6 = uVar6 + 1;
        uVar15 = *puVar10;
      } while (uVar9 != uVar6);
    }
    uVar12 = 1;
    if ((int)uVar4 < 1) {
      uVar12 = uVar4;
    }
    uVar12 = uVar12 - 1;
    uVar14 = uVar4;
    uVar15 = uVar9;
    do {
      uVar15 = uVar15 - 1;
      uVar6 = puVar2[uVar15 & 0xffffffff];
      if ((int)(uint)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar16 = uVar6 >> 1 & 0x7fffffff;
      pVVar3 = pAVar1->vObjs;
      if (pVVar3->nSize <= (int)uVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar7 = (long *)((ulong)((uint)uVar6 & 1) ^ (ulong)pVVar3->pArray[uVar16]);
      if ((((ulong)plVar7 & 1) == 0) && ((*(uint *)((long)plVar7 + 0x14) & 0xf) == 7)) {
        if (*puVar2 == uVar6) {
          bVar17 = true;
          uVar16 = 0;
          goto LAB_0025427a;
        }
        uVar15 = 0;
        goto LAB_00254258;
      }
      bVar17 = 1 < (int)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar17);
    goto LAB_002542b9;
  }
LAB_00254423:
  iVar13 = p->nSize;
  if (0 < (long)iVar13) {
    pwVar5 = p->pArray;
    lVar11 = 0;
    do {
      pwVar5[lVar11] = (long)(int)pwVar5[lVar11];
      lVar11 = lVar11 + 1;
    } while (iVar13 != lVar11);
  }
  return p;
  while (uVar16 = uVar15 + 1, lVar11 = uVar15 + 1, uVar15 = uVar16, puVar2[lVar11] != uVar6) {
LAB_00254258:
    if (uVar9 - 1 == uVar15) {
      bVar17 = false;
      uVar16 = (ulong)uVar4;
      goto LAB_0025427a;
    }
  }
  bVar17 = uVar16 < uVar9;
LAB_0025427a:
  uVar12 = uVar14;
  if ((uint)uVar16 != uVar4) {
    if (!bVar17) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x334,"int Vec_WrdRemove(Vec_Wrd_t *, word)");
    }
    uVar14 = (uint)uVar16 + 1;
    if ((int)uVar14 < (int)uVar4) {
      puVar10 = puVar2 + uVar14;
      do {
        iVar13 = (int)uVar16;
        puVar2[uVar16 & 0xffffffff] = *puVar10;
        puVar10 = puVar10 + 1;
        uVar16 = (ulong)(iVar13 + 1);
      } while (iVar13 + 2 < (int)uVar4);
    }
    p->nSize = uVar4 - 1;
  }
LAB_002542b9:
  if (uVar12 == 0) goto LAB_00254423;
  uVar4 = *(uint *)((long)plVar7 + 0x14);
  if ((uVar4 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0xbf,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  lVar11 = *(long *)(*(long *)(*plVar7 + 0x20) + 8);
  uVar9 = *(ulong *)(lVar11 + (long)*(int *)plVar7[4] * 8);
  uVar15 = uVar9 & 0xfffffffffffffffe;
  uVar12 = *(uint *)(uVar15 + 0x14);
  uVar14 = uVar12 & 0xf;
  if ((7 < uVar14) || ((0xa4U >> uVar14 & 1) == 0)) {
    __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0xc3,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  uVar6 = *(ulong *)(lVar11 + (long)((int *)plVar7[4])[1] * 8);
  uVar16 = uVar6 & 0xfffffffffffffffe;
  uVar14 = *(uint *)(uVar16 + 0x14) & 0xf;
  if ((7 < uVar14) || ((0xa4U >> uVar14 & 1) == 0)) {
    __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0xc4,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  iVar13 = *(int *)(uVar15 + 0x10);
  if (iVar13 < 0) goto LAB_002544f8;
  Vec_WrdPushOrder(p,CONCAT44(uVar12 >> 0xc,(((uint)uVar9 ^ uVar4 >> 10) & 1) + iVar13 * 2));
  if (*(int *)(uVar16 + 0x10) < 0) goto LAB_002544f8;
  Vec_WrdPushOrder(p,CONCAT44(*(uint *)(uVar16 + 0x14) >> 0xc,
                              (((uint)uVar6 ^ uVar4 >> 0xb) & 1) + *(int *)(uVar16 + 0x10) * 2));
  *pCounter = *pCounter + 1;
  uVar12 = p->nSize;
  if ((long)(int)uVar12 < 1) {
    uVar4 = 0;
  }
  else {
    pwVar5 = p->pArray;
    wVar8 = *pwVar5;
    uVar14 = 0;
    if (uVar12 != 1) {
      uVar14 = 0;
      lVar11 = 1;
      do {
        uVar9 = pwVar5[lVar11];
        if (uVar9 < wVar8) {
          __assert_fail("Num <= NumNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                        ,0xd2,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
        }
        if ((wVar8 + 1 == uVar9) && ((uVar9 & 1) != 0)) {
          p->nSize = 0;
          return p;
        }
        if (wVar8 < uVar9) {
          if (uVar12 <= uVar14) goto LAB_002544d9;
          uVar9 = (ulong)uVar14;
          uVar14 = uVar14 + 1;
          pwVar5[uVar9] = wVar8;
        }
        wVar8 = pwVar5[lVar11];
        lVar11 = lVar11 + 1;
      } while ((int)uVar12 != lVar11);
    }
    if (uVar12 <= uVar14) {
LAB_002544d9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
    }
    uVar4 = uVar14 + 1;
    pwVar5[uVar14] = wVar8;
  }
  if ((int)uVar12 < (int)uVar4) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                  ,0x255,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
  }
  p->nSize = uVar4;
  goto LAB_0025419f;
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperAnd( Abc_Obj_t * pObj, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k;
    assert( !Abc_ObjIsComplement(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjToLit(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract AND gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_ObjFromLit( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( !Abc_ObjIsComplement(pRoot) && Abc_ObjIsNode(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        assert( Abc_ObjIsNode(pRoot) );
        // extract
        pObj0 = Abc_ObjChild0(pRoot);
        pObj1 = Abc_ObjChild1(pRoot);
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0)) );
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj0)), Abc_ObjToLit(pObj0)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj1)), Abc_ObjToLit(pObj1)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num + 1 == NumNext && (NumNext & 1) ) // pos_lit & neg_lit = 0
            {
                Vec_WrdClear( vSuper );
                return vSuper;
            }
            if ( Num < NumNext )
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}